

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

double __thiscall
amrex::BaseFab<double>::sum<(amrex::RunOn)1>
          (BaseFab<double> *this,Box *bx,DestComp dcomp,NumComps ncomp)

{
  long in_RDI;
  Array4<const_double> *a;
  double r;
  undefined1 auStackY_1a8 [40];
  anon_class_80_3_e8713ce0 *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe8c;
  Box *in_stack_fffffffffffffe90;
  Array4<const_double> local_160;
  Array4<const_double> *local_120;
  double local_118;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_118 = 0.0;
  local_a8 = *(double **)(in_RDI + 0x10);
  local_b0 = (undefined8 *)(in_RDI + 0x18);
  local_b4 = *(int *)(in_RDI + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(in_RDI + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(in_RDI + 0x20);
  local_8 = (int *)(in_RDI + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = in_RDI + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(in_RDI + 0x28) + 1;
  local_28 = in_RDI + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(in_RDI + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<const_double>::Array4(&local_160,local_a8,&local_c0,&local_dc,local_b4);
  local_120 = &local_160;
  memcpy(auStackY_1a8,local_120,0x3c);
  LoopOnCpu<amrex::BaseFab<double>::sum<(amrex::RunOn)1>(amrex::Box_const&,amrex::DestComp,amrex::NumComps)const::_lambda(int,int,int,int)_1_>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80);
  return local_118;
}

Assistant:

T
BaseFab<T>::sum (const Box& bx, DestComp dcomp, NumComps ncomp) const noexcept
{
    AMREX_ASSERT(dcomp.i >= 0 && dcomp.i+ncomp.n <= this->nvar);

    T r = 0;
    Array4<T const> const& a = this->const_array();
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        ReduceOps<ReduceOpSum> reduce_op;
        ReduceData<T> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(bx, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            T t = 0;
            for (int n = 0; n < ncomp.n; ++n) {
                t += a(i,j,k,n+dcomp.i);
            }
            return { t };
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        r = amrex::get<0>(hv);
    } else
#endif
    {
        amrex::LoopOnCpu(bx, ncomp.n, [=,&r] (int i, int j, int k, int n) noexcept
        {
            r += a(i,j,k,n+dcomp.i);
        });
    }

    return r;
}